

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O2

void __thiscall pegmatite::ASTContainer::construct(ASTContainer *this)

{
  ErrorReporter *in_RCX;
  ASTStack *in_RDX;
  InputRange *in_RSI;
  
  construct((ASTContainer *)(&this->field_0x0 + *(long *)(*(long *)this + -0x18)),in_RSI,in_RDX,
            in_RCX);
  return;
}

Assistant:

bool ASTContainer::construct(const InputRange &r, ASTStack &st,
                             const ErrorReporter &err)
{
	bool success = true;

	for(auto it = members.rbegin(); it != members.rend(); ++it)
	{
		ASTMember *member = *it;
		success |= member->construct(r, st, err);
	}
	// We don't need the members vector anymore, so clean up the storage it
	// uses.
	members.clear();
	return success;
}